

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void blowfish_ssh1_decrypt_blk(ssh_cipher *cipher,void *blk,int len)

{
  uint32_t xL;
  uint32_t xR;
  uint uVar1;
  uint8_t *p;
  uint uVar2;
  uint32_t out [2];
  uint local_48;
  uint local_44;
  ssh_cipher *local_40;
  BlowfishContext *local_38;
  
  if ((len & 7U) == 0) {
    local_38 = (BlowfishContext *)(cipher + -0x20a);
    uVar1 = *(uint *)&cipher[-1].vt;
    uVar2 = *(uint *)((long)&cipher[-1].vt + 4);
    local_40 = cipher;
    for (; 0 < len; len = len + -8) {
      xL = *blk;
      xR = *(uint32_t *)((long)blk + 4);
      blowfish_decrypt(xL,xR,&local_48,local_38);
      uVar1 = uVar1 ^ local_48;
      uVar2 = uVar2 ^ local_44;
      *(char *)blk = (char)uVar1;
      *(char *)((long)blk + 1) = (char)(uVar1 >> 8);
      *(char *)((long)blk + 2) = (char)(uVar1 >> 0x10);
      *(char *)((long)blk + 3) = (char)(uVar1 >> 0x18);
      *(char *)((long)blk + 4) = (char)uVar2;
      *(char *)((long)blk + 5) = (char)(uVar2 >> 8);
      *(char *)((long)blk + 6) = (char)(uVar2 >> 0x10);
      *(char *)((long)blk + 7) = (char)(uVar2 >> 0x18);
      blk = (void *)((long)blk + 8);
      uVar1 = xL;
      uVar2 = xR;
    }
    *(uint *)&local_40[-1].vt = uVar1;
    *(uint *)((long)&local_40[-1].vt + 4) = uVar2;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x161,"void blowfish_lsb_decrypt_cbc(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_ssh1_decrypt_blk(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_lsb_decrypt_cbc(blk, len, &ctx->context);
}